

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Starting ");
  poVar1 = std::operator<<(poVar1,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_28,argv[1],&local_49);
  std::__cxx11::string::string((string *)&local_48,argv[2],&local_4a);
  clipCoverage(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"Ended");
  poVar1 = std::operator<<(poVar1,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout << "Starting "<< argv[1] << endl;
    clipCoverage(argv[1],argv[2]);
    cout << "Ended"<< argv[1] << endl;


}